

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesCacheEntryComposite.cxx
# Opt level: O0

void __thiscall
cmCursesCacheEntryComposite::cmCursesCacheEntryComposite
          (cmCursesCacheEntryComposite *this,string *key,int labelwidth,int entrywidth)

{
  cmCursesLabelWidget *pcVar1;
  cmCursesStringWidget *this_00;
  allocator local_51;
  string local_50;
  int local_20;
  int local_1c;
  int entrywidth_local;
  int labelwidth_local;
  string *key_local;
  cmCursesCacheEntryComposite *this_local;
  
  local_20 = entrywidth;
  local_1c = labelwidth;
  _entrywidth_local = key;
  key_local = (string *)this;
  std::__cxx11::string::string((string *)&this->Key,(string *)key);
  this->LabelWidth = local_1c;
  this->EntryWidth = local_20;
  pcVar1 = (cmCursesLabelWidget *)operator_new(0x40);
  cmCursesLabelWidget::cmCursesLabelWidget(pcVar1,this->LabelWidth,1,1,1,_entrywidth_local);
  this->Label = pcVar1;
  pcVar1 = (cmCursesLabelWidget *)operator_new(0x40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50," ",&local_51);
  cmCursesLabelWidget::cmCursesLabelWidget(pcVar1,1,1,1,1,&local_50);
  this->IsNewLabel = pcVar1;
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  this->Entry = (cmCursesWidget *)0x0;
  this_00 = (cmCursesStringWidget *)operator_new(0x50);
  cmCursesStringWidget::cmCursesStringWidget(this_00,this->EntryWidth,1,1,1);
  this->Entry = (cmCursesWidget *)this_00;
  return;
}

Assistant:

cmCursesCacheEntryComposite::cmCursesCacheEntryComposite(
                                                        const std::string& key,
                                                        int labelwidth,
                                                        int entrywidth) :
  Key(key), LabelWidth(labelwidth), EntryWidth(entrywidth)
{
  this->Label = new cmCursesLabelWidget(this->LabelWidth, 1, 1, 1, key);
  this->IsNewLabel = new cmCursesLabelWidget(1, 1, 1, 1, " ");
  this->Entry = 0;
  this->Entry = new cmCursesStringWidget(this->EntryWidth, 1, 1, 1);
}